

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  int *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int j;
  int i;
  sqlite3_index_constraint *pConstraint;
  PragmaVtab *pTab;
  int seen [2];
  int local_3c;
  int *local_38;
  int local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  in_RSI[0x10] = 0;
  in_RSI[0x11] = 0x3ff00000;
  if (*(char *)(in_RDI + 0x28) == '\0') {
    local_14 = 0;
  }
  else {
    local_38 = *(int **)(in_RSI + 2);
    local_10 = (undefined1 *)0x0;
    for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
      if (((int)(uint)*(byte *)(in_RDI + 0x29) <= *local_38) && ((char)local_38[1] == '\x02')) {
        if (*(char *)((long)local_38 + 5) == '\0') {
          local_14 = 0x13;
          goto LAB_001a3295;
        }
        *(int *)((long)&local_10 + (long)(int)(*local_38 - (uint)*(byte *)(in_RDI + 0x29)) * 4) =
             local_3c + 1;
      }
      local_38 = local_38 + 3;
    }
    if ((int)local_10 == 0) {
      in_RSI[0x10] = -0x400000;
      in_RSI[0x11] = 0x41dfffff;
      in_RSI[0x12] = 0x7fffffff;
      in_RSI[0x13] = 0;
      local_14 = 0;
    }
    else {
      *(undefined4 *)(*(long *)(in_RSI + 8) + (long)((int)local_10 + -1) * 8) = 1;
      *(undefined1 *)(*(long *)(in_RSI + 8) + 4 + (long)((int)local_10 + -1) * 8) = 1;
      in_RSI[0x10] = 0;
      in_RSI[0x11] = 0x40340000;
      in_RSI[0x12] = 0x14;
      in_RSI[0x13] = 0;
      if (local_10._4_4_ != 0) {
        *(undefined4 *)(*(long *)(in_RSI + 8) + (long)(local_10._4_4_ + -1) * 8) = 2;
        *(undefined1 *)(*(long *)(in_RSI + 8) + 4 + (long)(local_10._4_4_ + -1) * 8) = 1;
      }
      local_14 = 0;
    }
  }
LAB_001a3295:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int pragmaVtabBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  PragmaVtab *pTab = (PragmaVtab*)tab;
  const struct sqlite3_index_constraint *pConstraint;
  int i, j;
  int seen[2];

  pIdxInfo->estimatedCost = (double)1;
  if( pTab->nHidden==0 ){ return SQLITE_OK; }
  pConstraint = pIdxInfo->aConstraint;
  seen[0] = 0;
  seen[1] = 0;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    if( pConstraint->iColumn < pTab->iHidden ) continue;
    if( pConstraint->op!=SQLITE_INDEX_CONSTRAINT_EQ ) continue;
    if( pConstraint->usable==0 ) return SQLITE_CONSTRAINT;
    j = pConstraint->iColumn - pTab->iHidden;
    assert( j < 2 );
    seen[j] = i+1;
  }
  if( seen[0]==0 ){
    pIdxInfo->estimatedCost = (double)2147483647;
    pIdxInfo->estimatedRows = 2147483647;
    return SQLITE_OK;
  }
  j = seen[0]-1;
  pIdxInfo->aConstraintUsage[j].argvIndex = 1;
  pIdxInfo->aConstraintUsage[j].omit = 1;
  pIdxInfo->estimatedCost = (double)20;
  pIdxInfo->estimatedRows = 20;
  if( seen[1] ){
    j = seen[1]-1;
    pIdxInfo->aConstraintUsage[j].argvIndex = 2;
    pIdxInfo->aConstraintUsage[j].omit = 1;
  }
  return SQLITE_OK;
}